

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CjkBreakEngine::divideUpDictionaryRange
          (CjkBreakEngine *this,UText *inText,int32_t rangeStart,int32_t rangeEnd,
          UVector32 *foundBreaks)

{
  long lVar1;
  bool bVar2;
  UBool UVar3;
  UChar32 UVar4;
  undefined4 uVar5;
  int iVar6;
  int32_t iVar7;
  int iVar8;
  int64_t iVar9;
  UVector32 *this_00;
  undefined4 extraout_var;
  UnicodeSet *this_01;
  UVector32 *this_02;
  UVector32 *this_03;
  ushort uVar10;
  int32_t iVar11;
  undefined4 in_register_00000014;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  int iVar15;
  size_t sVar16;
  UnicodeString *size;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  UErrorCode status;
  ulong local_240;
  ulong local_238;
  undefined8 local_230;
  CjkBreakEngine *local_228;
  UVector32 t_boundary;
  UVector32 bestSnlp;
  UnicodeString inString;
  ConstChar16Ptr local_168;
  UVector32 prev;
  UVector32 lengths;
  UVector32 values;
  UText fu;
  int iVar21;
  
  local_230 = CONCAT44(in_register_00000014,rangeStart);
  if (rangeEnd - rangeStart == 0 || rangeEnd < rangeStart) {
    return 0;
  }
  inString.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_0024a818;
  inString.fUnion.fStackFields.fLengthAndFlags = 2;
  status = U_ZERO_ERROR;
  sVar16 = (size_t)rangeStart;
  lVar22 = (long)rangeEnd;
  local_228 = this;
  if (((((inText->providerProperties & 4) == 0) ||
       (lVar1 = inText->chunkNativeStart, (long)sVar16 < lVar1)) ||
      (inText->chunkNativeLimit < lVar22)) || ((long)inText->nativeIndexingLimit < lVar22 - lVar1))
  {
    local_238 = (ulong)(uint)rangeEnd;
    utext_setNativeIndex_63(inText,sVar16);
    iVar9 = utext_nativeLength_63(inText);
    if (iVar9 < lVar22) {
      local_238 = utext_nativeLength_63(inText);
    }
    this_00 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,sVar16);
    if (this_00 == (UVector32 *)0x0) {
      this_00 = (UVector32 *)0x0;
    }
    else {
      UVector32::UVector32(this_00,&status);
    }
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      if (this_00 == (UVector32 *)0x0) {
        status = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    else {
      if (this_00 != (UVector32 *)0x0) {
        (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
      }
      this_00 = (UVector32 *)0x0;
    }
    iVar7 = 0;
    if (U_ZERO_ERROR < status) goto LAB_0019cb5b;
    local_240 = CONCAT44(local_240._4_4_,status);
    lVar22 = (long)(int)local_238;
    while (iVar9 = utext_getNativeIndex_63(inText), iVar9 < lVar22) {
      iVar9 = utext_getNativeIndex_63(inText);
      UVar4 = utext_next32_63(inText);
      UnicodeString::append(&inString,UVar4);
      uVar5 = inString.fUnion.fFields.fLength;
      if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
        uVar5 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      iVar11 = this_00->count;
      while (iVar11 < (int)uVar5) {
        if (((-2 < iVar11) && (iVar11 < this_00->capacity)) ||
           (UVar3 = UVector32::expandCapacity(this_00,iVar11 + 1,&status), UVar3 != '\0')) {
          this_00->elements[this_00->count] = (int32_t)iVar9;
          this_00->count = this_00->count + 1;
        }
        iVar11 = this_00->count;
        uVar5 = inString.fUnion.fFields.fLength;
        if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
          uVar5 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
      }
    }
    iVar6 = this_00->count;
    if (((-2 < iVar6) && (iVar6 < this_00->capacity)) ||
       (UVar3 = UVector32::expandCapacity(this_00,iVar6 + 1,&status), UVar3 != '\0')) {
      this_00->elements[this_00->count] = (int32_t)local_238;
      this_00->count = this_00->count + 1;
    }
    if (0 < (int)local_240) goto LAB_0019cb5b;
  }
  else {
    local_168.p_ = inText->chunkContents + (sVar16 - lVar1);
    UnicodeString::setTo(&inString,'\0',&local_168,rangeEnd - rangeStart);
    this_00 = (UVector32 *)0x0;
  }
  size = &inString;
  iVar6 = (*(local_228->nfkcNorm2->super_UObject)._vptr_UObject[0xb])
                    (local_228->nfkcNorm2,size,&status);
  this_02 = this_00;
  if ((char)iVar6 == '\0') {
    fu._0_8_ = &PTR__UnicodeString_0024a818;
    fu.providerProperties._0_2_ = 2;
    this_02 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)size);
    if (this_02 == (UVector32 *)0x0) {
      this_02 = (UVector32 *)0x0;
    }
    else {
      UVector32::UVector32(this_02,&status);
    }
    if ((this_02 == (UVector32 *)0x0) && (status < U_ILLEGAL_ARGUMENT_ERROR)) {
      status = U_MEMORY_ALLOCATION_ERROR;
    }
    if (U_ZERO_ERROR < status) {
      if (this_02 != (UVector32 *)0x0) {
        (*(this_02->super_UObject)._vptr_UObject[1])(this_02);
      }
      UnicodeString::~UnicodeString((UnicodeString *)&fu);
      iVar7 = 0;
      goto LAB_0019cb5b;
    }
    bestSnlp.super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_0024a818;
    bestSnlp.count = CONCAT22(bestSnlp.count._2_2_,2);
    prev.super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_0024a818;
    prev.count = CONCAT22(prev.count._2_2_,2);
    uVar5 = inString.fUnion.fFields.fLength;
    if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
      uVar5 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (0 < (int)uVar5) {
      uVar23 = 0;
      do {
        uVar10 = (ushort)bestSnlp.count & 0x1e;
        if ((bestSnlp.count & 1U) != 0) {
          uVar10 = 2;
        }
        bestSnlp.count = CONCAT22(bestSnlp.count._2_2_,uVar10);
        iVar6 = (int)uVar23;
        uVar12 = UnicodeString::char32At(&inString,iVar6);
        uVar13 = uVar23;
        do {
          UnicodeString::append((UnicodeString *)&bestSnlp,uVar12);
          uVar20 = UnicodeString::moveIndex32(&inString,(int32_t)uVar13,1);
          uVar13 = (ulong)uVar20;
          uVar5 = inString.fUnion.fFields.fLength;
          if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
            uVar5 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if (uVar20 == uVar5) break;
          uVar12 = UnicodeString::char32At(&inString,uVar20);
          iVar17 = (*(local_228->nfkcNorm2->super_UObject)._vptr_UObject[0xf])
                             (local_228->nfkcNorm2,(ulong)uVar12);
        } while ((char)iVar17 == '\0');
        (*(local_228->nfkcNorm2->super_UObject)._vptr_UObject[3])
                  (local_228->nfkcNorm2,&bestSnlp,&prev,&status);
        iVar7 = prev.capacity;
        if (-1 < (short)prev.count) {
          iVar7 = (int)(short)prev.count >> 5;
        }
        UnicodeString::doAppend((UnicodeString *)&fu,(UnicodeString *)&prev,0,iVar7);
        if (this_00 == (UVector32 *)0x0) {
          iVar7 = iVar6 + (int)local_230;
        }
        else {
          iVar7 = 0;
          if ((-1 < iVar6) && (iVar6 < this_00->count && 0 < this_00->count)) {
            iVar7 = this_00->elements[uVar23];
          }
        }
        do {
          iVar6 = fu.sizeOfStruct;
          if (-1 < (short)fu.providerProperties) {
            iVar6 = (int)(short)fu.providerProperties >> 5;
          }
          iVar17 = this_02->count;
          if (iVar6 <= iVar17) break;
          if (((-2 < iVar17) && (iVar17 < this_02->capacity)) ||
             (UVar3 = UVector32::expandCapacity(this_02,iVar17 + 1,&status), UVar3 != '\0')) {
            this_02->elements[this_02->count] = iVar7;
            this_02->count = this_02->count + 1;
          }
        } while (status < U_ILLEGAL_ARGUMENT_ERROR);
        uVar5 = inString.fUnion.fFields.fLength;
        if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
          uVar5 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        uVar23 = (ulong)uVar20;
      } while ((int)uVar20 < (int)uVar5);
    }
    if (this_00 == (UVector32 *)0x0) {
      iVar7 = uVar5 + (int)local_230;
    }
    else {
      iVar7 = 0;
      if (((-1 < (int)uVar5) && (iVar7 = 0, 0 < this_00->count)) && ((int)uVar5 < this_00->count)) {
        iVar7 = this_00->elements[(uint)uVar5];
      }
    }
    UVector32::addElement(this_02,iVar7,&status);
    if (this_00 != (UVector32 *)0x0) {
      (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
    }
    UnicodeString::moveFrom(&inString,(UnicodeString *)&fu);
    UnicodeString::~UnicodeString((UnicodeString *)&prev);
    UnicodeString::~UnicodeString((UnicodeString *)&bestSnlp);
    UnicodeString::~UnicodeString((UnicodeString *)&fu);
  }
  sVar16 = 0;
  iVar7 = UnicodeString::countChar32(&inString,0,0x7fffffff);
  local_240 = CONCAT44(extraout_var,iVar7);
  uVar5 = inString.fUnion.fFields.fLength;
  if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
    uVar5 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  this_00 = this_02;
  if (iVar7 != uVar5) {
    if (this_02 == (UVector32 *)0x0) {
      this_03 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,sVar16);
      if (this_03 == (UVector32 *)0x0) {
        this_03 = (UVector32 *)0x0;
      }
      else {
        UVector32::UVector32(this_03,&status);
      }
      if (status < U_ILLEGAL_ARGUMENT_ERROR) {
        this_00 = this_03;
        if (this_03 == (UVector32 *)0x0) {
          status = U_MEMORY_ALLOCATION_ERROR;
        }
      }
      else if (this_03 != (UVector32 *)0x0) {
        (*(this_03->super_UObject)._vptr_UObject[1])(this_03);
      }
      iVar7 = 0;
      if (U_ZERO_ERROR < status) goto LAB_0019cb5b;
    }
    iVar6 = 0;
    uVar23 = 0;
    while( true ) {
      iVar17 = (int)uVar23;
      if (this_02 == (UVector32 *)0x0) {
        iVar8 = this_00->count;
        if (((-2 < iVar8) && (iVar8 < this_00->capacity)) ||
           (UVar3 = UVector32::expandCapacity(this_00,iVar8 + 1,&status), UVar3 != '\0')) {
          this_00->elements[this_00->count] = (int)local_230 + iVar17;
          this_00->count = this_00->count + 1;
        }
      }
      else {
        iVar7 = 0;
        if ((-1 < iVar17) && (iVar7 = 0, iVar17 < this_00->count && 0 < this_00->count)) {
          iVar7 = this_00->elements[uVar23];
        }
        UVector32::setElementAt(this_00,iVar7,iVar6);
      }
      uVar5 = inString.fUnion.fFields.fLength;
      if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
        uVar5 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (iVar17 == uVar5) break;
      iVar6 = iVar6 + 1;
      uVar12 = UnicodeString::moveIndex32(&inString,iVar17,1);
      uVar23 = (ulong)uVar12;
    }
  }
  iVar6 = (int)local_240;
  iVar17 = iVar6 + 1;
  UVector32::UVector32(&bestSnlp,iVar17,&status);
  if (((-2 < bestSnlp.count) && (bestSnlp.count < bestSnlp.capacity)) ||
     (UVar3 = UVector32::expandCapacity(&bestSnlp,bestSnlp.count + 1,&status), UVar3 != '\0')) {
    bestSnlp.elements[bestSnlp.count] = 0;
    bestSnlp.count = bestSnlp.count + 1;
  }
  if (0 < iVar6) {
    uVar23 = local_240 & 0xffffffff;
    do {
      if (((-2 < bestSnlp.count) && (bestSnlp.count < bestSnlp.capacity)) ||
         (UVar3 = UVector32::expandCapacity(&bestSnlp,bestSnlp.count + 1,&status), UVar3 != '\0')) {
        bestSnlp.elements[bestSnlp.count] = -1;
        bestSnlp.count = bestSnlp.count + 1;
      }
      uVar12 = (int)uVar23 - 1;
      uVar23 = (ulong)uVar12;
    } while (uVar12 != 0);
  }
  UVector32::UVector32(&prev,iVar17,&status);
  if (-1 < (int)local_240) {
    iVar6 = iVar17;
    do {
      if (((-2 < prev.count) && (prev.count < prev.capacity)) ||
         (UVar3 = UVector32::expandCapacity(&prev,prev.count + 1,&status), UVar3 != '\0')) {
        prev.elements[prev.count] = -1;
        prev.count = prev.count + 1;
      }
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  iVar7 = (int32_t)local_240;
  UVector32::UVector32(&values,iVar7,&status);
  UVector32::setSize(&values,iVar7);
  UVector32::UVector32(&lengths,iVar7,&status);
  UVector32::setSize(&lengths,iVar7);
  memset(&fu,0,0x90);
  fu.magic = 0x345ad82c;
  fu.sizeOfStruct = 0x90;
  utext_openUnicodeString_63(&fu,&inString,&status);
  if (0 < iVar7) {
    this_01 = &local_228->fHangulWordSet;
    uVar23 = local_240 & 0xffffffff;
    uVar13 = 0;
    bVar2 = false;
    iVar7 = 0;
    do {
      if (((long)bestSnlp.count <= (long)uVar13 || (long)bestSnlp.count < 1) ||
         (bestSnlp.elements[uVar13] != -1)) {
        utext_setNativeIndex_63(&fu,(long)iVar7);
        uVar12 = (*local_228->fDictionary->_vptr_DictionaryMatcher[2])
                           (local_228->fDictionary,&fu,0x14,local_240,0,lengths.elements,
                            values.elements,0);
        uVar19 = (ulong)uVar12;
        local_238 = CONCAT44(local_238._4_4_,iVar7);
        if ((uVar12 == 0) || ((lengths.count < 1 || (*lengths.elements != 1)))) {
          UVar4 = UnicodeString::char32At(&inString,iVar7);
          UVar3 = UnicodeSet::contains(this_01,UVar4);
          if (UVar3 == '\0') {
            UVector32::setElementAt(&values,0xff,uVar12);
            UVector32::setElementAt(&lengths,1,uVar12);
            uVar19 = (ulong)(uVar12 + 1);
          }
        }
        iVar6 = (int)uVar13;
        if (0 < (int)uVar19) {
          uVar18 = 0;
          do {
            iVar15 = 0;
            iVar8 = 0;
            if ((long)uVar13 < (long)bestSnlp.count) {
              iVar8 = bestSnlp.elements[uVar13];
            }
            if ((long)uVar18 < (long)values.count && 0 < (long)values.count) {
              iVar15 = values.elements[uVar18];
            }
            iVar21 = 0;
            if ((long)uVar18 < (long)lengths.count && 0 < (long)lengths.count) {
              iVar21 = lengths.elements[uVar18];
            }
            uVar20 = iVar21 + iVar6;
            uVar12 = 0;
            if (((-1 < (int)uVar20) && (uVar12 = 0, 0 < bestSnlp.count)) &&
               ((int)uVar20 < bestSnlp.count)) {
              uVar12 = bestSnlp.elements[uVar20];
            }
            if ((uint)(iVar15 + iVar8) < uVar12) {
              UVector32::setElementAt(&bestSnlp,iVar15 + iVar8,uVar20);
              UVector32::setElementAt(&prev,iVar6,uVar20);
            }
            uVar18 = uVar18 + 1;
          } while (uVar19 != uVar18);
        }
        iVar7 = (int)local_238;
        UVar4 = UnicodeString::char32At(&inString,(int)local_238);
        bVar14 = UVar4 != 0x30fb && UVar4 - 0x30a1U < 0x5e || UVar4 - 0xff66U < 0x3a;
        bVar24 = !bVar2;
        bVar2 = bVar14;
        if (bVar24 && bVar14 == true) {
          iVar7 = UnicodeString::moveIndex32(&inString,iVar7,1);
          uVar5 = inString.fUnion.fFields.fLength;
          if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
            uVar5 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          if (iVar7 < (int)uVar5) {
            uVar19 = 1;
            bVar24 = true;
            while( true ) {
              UVar4 = UnicodeString::char32At(&inString,iVar7);
              uVar12 = (uint)uVar19;
              if ((0x39 < UVar4 - 0xff66U) && (UVar4 == 0x30fb || 0x5d < UVar4 - 0x30a1U)) break;
              iVar7 = UnicodeString::moveIndex32(&inString,iVar7,1);
              uVar5 = inString.fUnion.fFields.fLength;
              if (-1 < inString.fUnion.fStackFields.fLengthAndFlags) {
                uVar5 = (int)inString.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              uVar19 = (ulong)(uVar12 + 1);
              bVar24 = uVar12 < 0x13;
              if (((int)uVar5 <= iVar7) || (0x12 < uVar12)) break;
            }
          }
          else {
            bVar24 = true;
            uVar19 = 1;
          }
          iVar7 = (int)local_238;
          if (bVar24) {
            iVar8 = 0;
            if ((long)uVar13 < (long)bestSnlp.count && 0 < (long)bestSnlp.count) {
              iVar8 = bestSnlp.elements[uVar13];
            }
            iVar15 = 0x2000;
            if ((uint)uVar19 < 9) {
              iVar15 = *(int *)(getKatakanaCost(int)::katakanaCost + uVar19 * 4);
            }
            uVar20 = (uint)uVar19 + iVar6;
            uVar12 = 0;
            if ((int)uVar20 < bestSnlp.count && 0 < bestSnlp.count) {
              uVar12 = bestSnlp.elements[uVar20];
            }
            if ((uint)(iVar15 + iVar8) < uVar12) {
              UVector32::setElementAt(&bestSnlp,iVar15 + iVar8,uVar20);
              UVector32::setElementAt(&prev,iVar6,uVar20);
            }
          }
        }
      }
      iVar7 = UnicodeString::moveIndex32(&inString,iVar7,1);
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar23);
  }
  utext_close_63(&fu);
  UVector32::UVector32(&t_boundary,iVar17,&status);
  iVar6 = (int)local_240;
  if (((iVar6 < 0) || (bestSnlp.count <= iVar6 || bestSnlp.count < 1)) ||
     (bestSnlp.elements[local_240 & 0xffffffff] != -1)) {
    uVar23 = 0;
    if (0 < iVar6) {
      uVar13 = local_240;
      do {
        if (((-2 < t_boundary.count) && (t_boundary.count < t_boundary.capacity)) ||
           (UVar3 = UVector32::expandCapacity(&t_boundary,t_boundary.count + 1,&status),
           UVar3 != '\0')) {
          t_boundary.elements[t_boundary.count] = (int)uVar13;
          t_boundary.count = t_boundary.count + 1;
        }
        uVar12 = 0;
        if ((0 < prev.count) && (uVar12 = 0, (int)uVar13 < prev.count)) {
          uVar12 = prev.elements[uVar13 & 0xffffffff];
        }
        uVar23 = (ulong)((int)uVar23 + 1);
        uVar13 = (ulong)uVar12;
      } while (0 < (int)uVar12);
    }
  }
  else {
    if (((-2 < t_boundary.count) && (t_boundary.count < t_boundary.capacity)) ||
       (UVar3 = UVector32::expandCapacity(&t_boundary,t_boundary.count + 1,&status), UVar3 != '\0'))
    {
      t_boundary.elements[t_boundary.count] = iVar6;
      t_boundary.count = t_boundary.count + 1;
    }
    uVar23 = 1;
  }
  uVar12 = foundBreaks->count;
  if ((ulong)uVar12 == 0) {
LAB_0019c730:
    if (((-2 < t_boundary.count) && (t_boundary.count < t_boundary.capacity)) ||
       (UVar3 = UVector32::expandCapacity(&t_boundary,t_boundary.count + 1,&status), UVar3 != '\0'))
    {
      t_boundary.elements[t_boundary.count] = 0;
      t_boundary.count = t_boundary.count + 1;
    }
    uVar23 = (ulong)((int)uVar23 + 1);
  }
  else {
    if ((int)uVar12 < 1) {
      iVar6 = 0;
    }
    else {
      iVar6 = foundBreaks->elements[(ulong)uVar12 - 1];
    }
    if (iVar6 < (int)local_230) goto LAB_0019c730;
  }
  iVar7 = (int32_t)uVar23;
  if (0 < iVar7) {
    uVar13 = uVar23;
    iVar6 = -1;
    do {
      uVar19 = 0;
      if ((0 < (long)t_boundary.count) && ((long)uVar13 <= (long)t_boundary.count)) {
        uVar19 = (ulong)(uint)t_boundary.elements[uVar13 - 1];
      }
      iVar17 = (int)uVar19;
      if (this_00 == (UVector32 *)0x0) {
        iVar11 = iVar17 + (int)local_230;
      }
      else {
        iVar11 = 0;
        if (((-1 < iVar17) && (0 < this_00->count)) && (iVar11 = 0, iVar17 < this_00->count)) {
          iVar11 = this_00->elements[uVar19];
        }
      }
      if (iVar6 < iVar11) {
        iVar6 = foundBreaks->count;
        if (((-2 < iVar6) && (iVar6 < foundBreaks->capacity)) ||
           (UVar3 = UVector32::expandCapacity(foundBreaks,iVar6 + 1,&status), UVar3 != '\0')) {
          foundBreaks->elements[foundBreaks->count] = iVar11;
          foundBreaks->count = foundBreaks->count + 1;
        }
      }
      else {
        uVar23 = (ulong)((int)uVar23 - 1);
      }
      iVar7 = (int32_t)uVar23;
      bVar2 = 1 < (long)uVar13;
      uVar13 = uVar13 - 1;
      iVar6 = iVar11;
    } while (bVar2);
  }
  UVector32::~UVector32(&t_boundary);
  UVector32::~UVector32(&lengths);
  UVector32::~UVector32(&values);
  UVector32::~UVector32(&prev);
  UVector32::~UVector32(&bestSnlp);
LAB_0019cb5b:
  if (this_00 != (UVector32 *)0x0) {
    (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
  }
  UnicodeString::~UnicodeString(&inString);
  return iVar7;
}

Assistant:

int32_t 
CjkBreakEngine::divideUpDictionaryRange( UText *inText,
        int32_t rangeStart,
        int32_t rangeEnd,
        UVector32 &foundBreaks ) const {
    if (rangeStart >= rangeEnd) {
        return 0;
    }

    // UnicodeString version of input UText, NFKC normalized if necessary.
    UnicodeString inString;

    // inputMap[inStringIndex] = corresponding native index from UText inText.
    // If NULL then mapping is 1:1
    LocalPointer<UVector32>     inputMap;

    UErrorCode     status      = U_ZERO_ERROR;


    // if UText has the input string as one contiguous UTF-16 chunk
    if ((inText->providerProperties & utext_i32_flag(UTEXT_PROVIDER_STABLE_CHUNKS)) &&
         inText->chunkNativeStart <= rangeStart &&
         inText->chunkNativeLimit >= rangeEnd   &&
         inText->nativeIndexingLimit >= rangeEnd - inText->chunkNativeStart) {

        // Input UText is in one contiguous UTF-16 chunk.
        // Use Read-only aliasing UnicodeString.
        inString.setTo(FALSE,
                       inText->chunkContents + rangeStart - inText->chunkNativeStart,
                       rangeEnd - rangeStart);
    } else {
        // Copy the text from the original inText (UText) to inString (UnicodeString).
        // Create a map from UnicodeString indices -> UText offsets.
        utext_setNativeIndex(inText, rangeStart);
        int32_t limit = rangeEnd;
        U_ASSERT(limit <= utext_nativeLength(inText));
        if (limit > utext_nativeLength(inText)) {
            limit = (int32_t)utext_nativeLength(inText);
        }
        inputMap.adoptInsteadAndCheckErrorCode(new UVector32(status), status);
        if (U_FAILURE(status)) {
            return 0;
        }
        while (utext_getNativeIndex(inText) < limit) {
            int32_t nativePosition = (int32_t)utext_getNativeIndex(inText);
            UChar32 c = utext_next32(inText);
            U_ASSERT(c != U_SENTINEL);
            inString.append(c);
            while (inputMap->size() < inString.length()) {
                inputMap->addElement(nativePosition, status);
            }
        }
        inputMap->addElement(limit, status);
    }


    if (!nfkcNorm2->isNormalized(inString, status)) {
        UnicodeString normalizedInput;
        //  normalizedMap[normalizedInput position] ==  original UText position.
        LocalPointer<UVector32> normalizedMap(new UVector32(status), status);
        if (U_FAILURE(status)) {
            return 0;
        }
        
        UnicodeString fragment;
        UnicodeString normalizedFragment;
        for (int32_t srcI = 0; srcI < inString.length();) {  // Once per normalization chunk
            fragment.remove();
            int32_t fragmentStartI = srcI;
            UChar32 c = inString.char32At(srcI);
            for (;;) {
                fragment.append(c);
                srcI = inString.moveIndex32(srcI, 1);
                if (srcI == inString.length()) {
                    break;
                }
                c = inString.char32At(srcI);
                if (nfkcNorm2->hasBoundaryBefore(c)) {
                    break;
                }
            }
            nfkcNorm2->normalize(fragment, normalizedFragment, status);
            normalizedInput.append(normalizedFragment);

            // Map every position in the normalized chunk to the start of the chunk
            //   in the original input.
            int32_t fragmentOriginalStart = inputMap.isValid() ?
                    inputMap->elementAti(fragmentStartI) : fragmentStartI+rangeStart;
            while (normalizedMap->size() < normalizedInput.length()) {
                normalizedMap->addElement(fragmentOriginalStart, status);
                if (U_FAILURE(status)) {
                    break;
                }
            }
        }
        U_ASSERT(normalizedMap->size() == normalizedInput.length());
        int32_t nativeEnd = inputMap.isValid() ?
                inputMap->elementAti(inString.length()) : inString.length()+rangeStart;
        normalizedMap->addElement(nativeEnd, status);

        inputMap.moveFrom(normalizedMap);
        inString.moveFrom(normalizedInput);
    }

    int32_t numCodePts = inString.countChar32();
    if (numCodePts != inString.length()) {
        // There are supplementary characters in the input.
        // The dictionary will produce boundary positions in terms of code point indexes,
        //   not in terms of code unit string indexes.
        // Use the inputMap mechanism to take care of this in addition to indexing differences
        //    from normalization and/or UTF-8 input.
        UBool hadExistingMap = inputMap.isValid();
        if (!hadExistingMap) {
            inputMap.adoptInsteadAndCheckErrorCode(new UVector32(status), status);
            if (U_FAILURE(status)) {
                return 0;
            }
        }
        int32_t cpIdx = 0;
        for (int32_t cuIdx = 0; ; cuIdx = inString.moveIndex32(cuIdx, 1)) {
            U_ASSERT(cuIdx >= cpIdx);
            if (hadExistingMap) {
                inputMap->setElementAt(inputMap->elementAti(cuIdx), cpIdx);
            } else {
                inputMap->addElement(cuIdx+rangeStart, status);
            }
            cpIdx++;
            if (cuIdx == inString.length()) {
               break;
            }
        }
    }
                
    // bestSnlp[i] is the snlp of the best segmentation of the first i
    // code points in the range to be matched.
    UVector32 bestSnlp(numCodePts + 1, status);
    bestSnlp.addElement(0, status);
    for(int32_t i = 1; i <= numCodePts; i++) {
        bestSnlp.addElement(kuint32max, status);
    }


    // prev[i] is the index of the last CJK code point in the previous word in 
    // the best segmentation of the first i characters.
    UVector32 prev(numCodePts + 1, status);
    for(int32_t i = 0; i <= numCodePts; i++){
        prev.addElement(-1, status);
    }

    const int32_t maxWordSize = 20;
    UVector32 values(numCodePts, status);
    values.setSize(numCodePts);
    UVector32 lengths(numCodePts, status);
    lengths.setSize(numCodePts);

    UText fu = UTEXT_INITIALIZER;
    utext_openUnicodeString(&fu, &inString, &status);

    // Dynamic programming to find the best segmentation.

    // In outer loop, i  is the code point index,
    //                ix is the corresponding string (code unit) index.
    //    They differ when the string contains supplementary characters.
    int32_t ix = 0;
    bool is_prev_katakana = false;
    for (int32_t i = 0;  i < numCodePts;  ++i, ix = inString.moveIndex32(ix, 1)) {
        if ((uint32_t)bestSnlp.elementAti(i) == kuint32max) {
            continue;
        }

        int32_t count;
        utext_setNativeIndex(&fu, ix);
        count = fDictionary->matches(&fu, maxWordSize, numCodePts,
                             NULL, lengths.getBuffer(), values.getBuffer(), NULL);
                             // Note: lengths is filled with code point lengths
                             //       The NULL parameter is the ignored code unit lengths.

        // if there are no single character matches found in the dictionary 
        // starting with this character, treat character as a 1-character word 
        // with the highest value possible, i.e. the least likely to occur.
        // Exclude Korean characters from this treatment, as they should be left
        // together by default.
        if ((count == 0 || lengths.elementAti(0) != 1) &&
                !fHangulWordSet.contains(inString.char32At(ix))) {
            values.setElementAt(maxSnlp, count);   // 255
            lengths.setElementAt(1, count++);
        }

        for (int32_t j = 0; j < count; j++) {
            uint32_t newSnlp = (uint32_t)bestSnlp.elementAti(i) + (uint32_t)values.elementAti(j);
            int32_t ln_j_i = lengths.elementAti(j) + i;
            if (newSnlp < (uint32_t)bestSnlp.elementAti(ln_j_i)) {
                bestSnlp.setElementAt(newSnlp, ln_j_i);
                prev.setElementAt(i, ln_j_i);
            }
        }

        // In Japanese,
        // Katakana word in single character is pretty rare. So we apply
        // the following heuristic to Katakana: any continuous run of Katakana
        // characters is considered a candidate word with a default cost
        // specified in the katakanaCost table according to its length.

        bool is_katakana = isKatakana(inString.char32At(ix));
        int32_t katakanaRunLength = 1;
        if (!is_prev_katakana && is_katakana) {
            int32_t j = inString.moveIndex32(ix, 1);
            // Find the end of the continuous run of Katakana characters
            while (j < inString.length() && katakanaRunLength < kMaxKatakanaGroupLength &&
                    isKatakana(inString.char32At(j))) {
                j = inString.moveIndex32(j, 1);
                katakanaRunLength++;
            }
            if (katakanaRunLength < kMaxKatakanaGroupLength) {
                uint32_t newSnlp = bestSnlp.elementAti(i) + getKatakanaCost(katakanaRunLength);
                if (newSnlp < (uint32_t)bestSnlp.elementAti(i+katakanaRunLength)) {
                    bestSnlp.setElementAt(newSnlp, i+katakanaRunLength);
                    prev.setElementAt(i, i+katakanaRunLength);  // prev[j] = i;
                }
            }
        }
        is_prev_katakana = is_katakana;
    }
    utext_close(&fu);

    // Start pushing the optimal offset index into t_boundary (t for tentative).
    // prev[numCodePts] is guaranteed to be meaningful.
    // We'll first push in the reverse order, i.e.,
    // t_boundary[0] = numCodePts, and afterwards do a swap.
    UVector32 t_boundary(numCodePts+1, status);

    int32_t numBreaks = 0;
    // No segmentation found, set boundary to end of range
    if ((uint32_t)bestSnlp.elementAti(numCodePts) == kuint32max) {
        t_boundary.addElement(numCodePts, status);
        numBreaks++;
    } else {
        for (int32_t i = numCodePts; i > 0; i = prev.elementAti(i)) {
            t_boundary.addElement(i, status);
            numBreaks++;
        }
        U_ASSERT(prev.elementAti(t_boundary.elementAti(numBreaks - 1)) == 0);
    }

    // Add a break for the start of the dictionary range if there is not one
    // there already.
    if (foundBreaks.size() == 0 || foundBreaks.peeki() < rangeStart) {
        t_boundary.addElement(0, status);
        numBreaks++;
    }

    // Now that we're done, convert positions in t_boundary[] (indices in 
    // the normalized input string) back to indices in the original input UText
    // while reversing t_boundary and pushing values to foundBreaks.
    int32_t prevCPPos = -1;
    int32_t prevUTextPos = -1;
    for (int32_t i = numBreaks-1; i >= 0; i--) {
        int32_t cpPos = t_boundary.elementAti(i);
        U_ASSERT(cpPos > prevCPPos);
        int32_t utextPos =  inputMap.isValid() ? inputMap->elementAti(cpPos) : cpPos + rangeStart;
        U_ASSERT(utextPos >= prevUTextPos);
        if (utextPos > prevUTextPos) {
            // Boundaries are added to foundBreaks output in ascending order.
            U_ASSERT(foundBreaks.size() == 0 || foundBreaks.peeki() < utextPos);
            foundBreaks.push(utextPos, status);
        } else {
            // Normalization expanded the input text, the dictionary found a boundary
            // within the expansion, giving two boundaries with the same index in the
            // original text. Ignore the second. See ticket #12918.
            --numBreaks;
        }
        prevCPPos = cpPos;
        prevUTextPos = utextPos;
    }
    (void)prevCPPos; // suppress compiler warnings about unused variable

    // inString goes out of scope
    // inputMap goes out of scope
    return numBreaks;
}